

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall CConnman::DumpAddresses(CConnman *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  Logger *this_00;
  long *args_1;
  long lVar4;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = std::chrono::_V2::steady_clock::now();
  DumpPeerAddresses(&gArgs,this->addrman);
  this_00 = LogInstance();
  bVar2 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
  if (bVar2) {
    args_1 = (long *)AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
    lVar4 = std::chrono::_V2::steady_clock::now();
    logging_function._M_str = "DumpAddresses";
    logging_function._M_len = 0xd;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file._M_len = 0x50;
    LogPrintf_<unsigned_long,long>
              (logging_function,source_file,0x919,
               IPC|MEMPOOLREJ|ESTIMATEFEE|RPC|BENCH|HTTP|MEMPOOL|TOR|NET,
               (Level)&stack0xffffffffffffffe0,&stack0xffffffffffffffd8,
               (unsigned_long *)((lVar4 - lVar3) / 1000000),args_1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::DumpAddresses()
{
    const auto start{SteadyClock::now()};

    DumpPeerAddresses(::gArgs, addrman);

    LogDebug(BCLog::NET, "Flushed %d addresses to peers.dat  %dms\n",
             addrman.Size(), Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
}